

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O3

void test<std::vector<unsigned_long,std::allocator<unsigned_long>>>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *arities,size_t attempts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer puVar3;
  pointer plVar4;
  pointer plVar5;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  pointer puVar11;
  vector<long,_std::allocator<long>_> numbers;
  long *local_88;
  long local_80;
  long local_78 [2];
  default_constructor<std::set<long,_std::less<long>,_std::allocator<long>_>_> local_68;
  vector<long,_std::allocator<long>_> local_48;
  
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (long *)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (long *)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  utility::read<std::vector<long,std::allocator<long>>>((istream *)&std::cin,&local_48);
  plVar5 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar4 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar6 = (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar9 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar4,plVar5);
    if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      plVar10 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      do {
        plVar7 = plVar10;
        if (plVar7 == local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_001061e2;
        plVar10 = plVar7 + 1;
      } while (plVar7[-1] != *plVar7);
      plVar8 = plVar7 + -1;
      lVar9 = plVar7[-1];
      for (; plVar10 !=
             local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish; plVar10 = plVar10 + 1) {
        lVar2 = *plVar10;
        if (lVar9 != lVar2) {
          plVar8[1] = lVar2;
          plVar8 = plVar8 + 1;
        }
        lVar9 = lVar2;
      }
      if (plVar8 + 1 !=
          local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = plVar8 + 1;
      }
    }
  }
LAB_001061e2:
  puVar11 = (arities->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (arities->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar11 != puVar3) {
    do {
      local_68.name._M_dataplus._M_p = (pointer)*puVar11;
      test_one<std::vector<long,std::allocator<long>>,k_ary_constructor<long>>
                (&local_48,attempts,(k_ary_constructor<long> *)&local_68);
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar3);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"set","");
  paVar1 = &local_68.name.field_2;
  local_68.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_88,local_80 + (long)local_88);
  test_one<std::vector<long,std::allocator<long>>,default_constructor<std::set<long,std::less<long>,std::allocator<long>>>>
            (&local_48,attempts,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"flat_set","");
  local_68.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_88,local_80 + (long)local_88);
  test_one<std::vector<long,std::allocator<long>>,default_constructor<boost::container::flat_set<long,std::less<long>,void>>>
            (&local_48,attempts,
             (default_constructor<boost::container::flat_set<long,_std::less<long>,_void>_> *)
             &local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"hash_set","");
  local_68.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_88,local_80 + (long)local_88);
  test_one<std::vector<long,std::allocator<long>>,default_constructor<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>
            (&local_48,attempts,
             (default_constructor<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>
              *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test (const Container & arities, std::size_t attempts)
{
    using integer_type = std::int64_t;
    std::vector<integer_type> numbers;
    utility::read(std::cin, numbers);
    std::sort(numbers.begin(), numbers.end());
    numbers.erase(std::unique(numbers.begin(), numbers.end()), numbers.end());

    for (auto arity: arities)
    {
        test_one(numbers, attempts, k_ary_constructor<integer_type>(arity));
    }

    test_one(numbers, attempts, default_constructor<std::set<integer_type>>("set"));
    test_one(numbers, attempts, default_constructor<boost::container::flat_set<integer_type>>("flat_set"));
    test_one(numbers, attempts, default_constructor<std::unordered_set<integer_type>>("hash_set"));
}